

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_g_Module.cpp
# Opt level: O0

void __thiscall axl::g::Module::Module(Module *this)

{
  long lVar1;
  long *in_RDI;
  
  sys::Lock::Lock((Lock *)0x17acb1);
  sl::
  List<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
  ::List((List<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
          *)0x17acc4);
  lVar1 = sysconf(0x54);
  *in_RDI = lVar1;
  lVar1 = sysconf(0x1e);
  in_RDI[1] = lVar1;
  lVar1 = sysconf(0x1e);
  in_RDI[2] = lVar1;
  sys::initPreciseTimestamps();
  return;
}

Assistant:

Module::Module() {
#if (_AXL_OS_WIN)
	_CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF);

	m_hModule = ::GetModuleHandle(NULL);

	SYSTEM_INFO systemInfo;
	::GetSystemInfo(&systemInfo);
	m_systemInfo.m_processorCount     = systemInfo.dwNumberOfProcessors;
	m_systemInfo.m_pageSize           = systemInfo.dwPageSize;
	m_systemInfo.m_mappingAlignFactor = systemInfo.dwAllocationGranularity;

	sys::win::initNtDllFunctions();
#elif (_AXL_OS_POSIX)
	m_systemInfo.m_processorCount     = sysconf(_SC_NPROCESSORS_ONLN);
	m_systemInfo.m_pageSize           = sysconf(_SC_PAGE_SIZE);
	m_systemInfo.m_mappingAlignFactor = sysconf(_SC_PAGE_SIZE);
#endif

	sys::initPreciseTimestamps();
}